

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-math.c
# Opt level: O1

void PVG_FT_Vector_Rotate(PVG_FT_Vector *vec,PVG_FT_Angle angle)

{
  uint uVar1;
  long lVar2;
  byte bVar3;
  PVG_FT_Fixed s;
  long lVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  PVG_FT_Vector v;
  PVG_FT_Vector local_28;
  
  local_28.x = vec->x;
  local_28.y = vec->y;
  if (local_28.x != 0 || local_28.y != 0) {
    lVar2 = -local_28.x;
    if (0 < local_28.x) {
      lVar2 = local_28.x;
    }
    lVar4 = -local_28.y;
    if (0 < local_28.y) {
      lVar4 = local_28.y;
    }
    uVar7 = (uint)lVar4 | (uint)lVar2;
    uVar1 = 0x1f;
    if (uVar7 != 0) {
      for (; uVar7 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    if (uVar1 < 0x1e) {
      iVar8 = 0x1d - uVar1;
      local_28.x = local_28.x << ((byte)iVar8 & 0x3f);
      local_28.y = local_28.y << ((byte)iVar8 & 0x3f);
    }
    else {
      iVar8 = (uVar1 ^ 0x1f) - 2;
      bVar3 = 2 - (char)(uVar1 ^ 0x1f);
      local_28.x = local_28.x >> (bVar3 & 0x3f);
      local_28.y = local_28.y >> (bVar3 & 0x3f);
    }
    ft_trig_pseudo_rotate(&local_28,angle);
    lVar2 = -local_28.x;
    if (0 < local_28.x) {
      lVar2 = local_28.x;
    }
    lVar4 = lVar2 * 0xdbd95b16 + 0x100000000 >> 0x20;
    lVar2 = -lVar4;
    if (-1 < local_28.x) {
      lVar2 = lVar4;
    }
    lVar4 = -local_28.y;
    if (0 < local_28.y) {
      lVar4 = local_28.y;
    }
    lVar5 = lVar4 * 0xdbd95b16 + 0x100000000 >> 0x20;
    lVar4 = -lVar5;
    if (-1 < local_28.y) {
      lVar4 = lVar5;
    }
    bVar3 = (byte)iVar8;
    if (iVar8 < 1) {
      vec->x = lVar2 << (-bVar3 & 0x3f);
      lVar4 = lVar4 << (-bVar3 & 0x3f);
    }
    else {
      uVar6 = (ulong)(uint)(1 << (bVar3 - 1 & 0x1f));
      vec->x = (long)((lVar2 >> 0x3f) + lVar2 + uVar6) >> (bVar3 & 0x3f);
      lVar4 = (long)((lVar4 >> 0x3f) + lVar4 + uVar6) >> (bVar3 & 0x3f);
    }
    vec->y = lVar4;
  }
  return;
}

Assistant:

void PVG_FT_Vector_Rotate(PVG_FT_Vector* vec, PVG_FT_Angle angle)
{
    PVG_FT_Int     shift;
    PVG_FT_Vector  v = *vec;

    if ( v.x == 0 && v.y == 0 )
        return;

    shift = ft_trig_prenorm( &v );
    ft_trig_pseudo_rotate( &v, angle );
    v.x = ft_trig_downscale( v.x );
    v.y = ft_trig_downscale( v.y );

    if ( shift > 0 )
    {
        PVG_FT_Int32  half = (PVG_FT_Int32)1L << ( shift - 1 );


        vec->x = ( v.x + half - ( v.x < 0 ) ) >> shift;
        vec->y = ( v.y + half - ( v.y < 0 ) ) >> shift;
    }
    else
    {
        shift  = -shift;
        vec->x = (PVG_FT_Pos)( (PVG_FT_ULong)v.x << shift );
        vec->y = (PVG_FT_Pos)( (PVG_FT_ULong)v.y << shift );
    }
}